

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void container_printf(container_t *c,uint8_t type)

{
  uint8_t local_11;
  array_container_t *paStack_10;
  uint8_t type_local;
  container_t *c_local;
  
  local_11 = type;
  paStack_10 = (array_container_t *)c;
  paStack_10 = (array_container_t *)container_unwrap_shared(c,&local_11);
  if (local_11 == '\x01') {
    bitset_container_printf((bitset_container_t *)paStack_10);
  }
  else if (local_11 == '\x02') {
    array_container_printf(paStack_10);
  }
  else {
    run_container_printf((run_container_t *)paStack_10);
  }
  return;
}

Assistant:

void container_printf(const container_t *c, uint8_t type) {
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_printf(const_CAST_bitset(c));
            return;
        case ARRAY_CONTAINER_TYPE:
            array_container_printf(const_CAST_array(c));
            return;
        case RUN_CONTAINER_TYPE:
            run_container_printf(const_CAST_run(c));
            return;
        default:
            __builtin_unreachable();
    }
}